

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsPrivateFreeDetachedArrayBuffer(void *detachedState)

{
  ArrayBufferDetachedStateBase *state;
  AutoNestedHandledExceptionType local_38 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  Js::DetachedStateBase::CleanUp((DetachedStateBase *)detachedState);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
  return JsNoError;
}

Assistant:

CHAKRA_API JsPrivateFreeDetachedArrayBuffer(_In_ void* detachedState)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        auto state = reinterpret_cast<Js::ArrayBufferDetachedStateBase*>(detachedState);
        state->CleanUp();
        return JsNoError;
    });
}